

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::CampaignManager::Open(CampaignManager *this,string *name,UserOptions *options)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  uint uVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  uint __len;
  string __str;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->m_Options).active = (options->campaign).active;
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).hostname);
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).campaignstorepath);
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).cachepath);
  (this->m_Options).verbose = (options->campaign).verbose;
  local_70 = local_60;
  pcVar3 = (this->m_CampaignDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->m_CampaignDir)._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(name->_M_dataplus)._M_p);
  local_50 = &local_40;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar5[3];
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_a0 = *puVar10;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar10;
    local_b0 = (ulong *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar2 = this->m_WriterRank;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00673e12;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00673e12;
      }
      if (uVar8 < 10000) goto LAB_00673e12;
      uVar11 = uVar11 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_00673e12:
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),__len,__val);
  uVar11 = 0xf;
  if (local_b0 != &local_a0) {
    uVar11 = local_a0;
  }
  if (uVar11 < (ulong)(local_c8 + local_a8)) {
    uVar11 = 0xf;
    if (local_d0 != local_c0) {
      uVar11 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_a8) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00673ea0;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
LAB_00673ea0:
  local_90 = &local_80;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar6[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar6;
  }
  local_88 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->m_Name,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (0 < (this->m_Options).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Campaign Manager ",0x11);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,this->m_WriterRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Open(",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->m_Name)._M_dataplus._M_p,(this->m_Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
  }
  this->m_Opened = true;
  return;
}

Assistant:

void CampaignManager::Open(const std::string &name, const UserOptions &options)
{
    const UserOptions::Campaign &opts = options.campaign;
    m_Options.active = opts.active;
    m_Options.hostname = opts.hostname;
    m_Options.campaignstorepath = opts.campaignstorepath;
    m_Options.cachepath = opts.cachepath;
    m_Options.verbose = opts.verbose;

    m_Name = m_CampaignDir + PathSeparator + name + "_" + std::to_string(m_WriterRank);
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << " Open(" << m_Name << ")\n";
    }
    m_Opened = true;
}